

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::verticalScrollbarValueChanged(QAbstractItemView *this,int value)

{
  QAbstractItemViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  char cVar2;
  int iVar3;
  QScrollBar *this_01;
  QWidget *pQVar4;
  long in_FS_OFFSET;
  QPoint local_58;
  undefined1 local_50 [24];
  long local_38;
  
  local_50._8_8_ = local_50._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  this_01 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
  iVar3 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
  if (iVar3 == value) {
    pQVar1 = this_00->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_50,&this_00->root);
    cVar2 = (**(code **)(*(long *)pQVar1 + 0x130))(pQVar1,(QModelIndex *)local_50);
    if (cVar2 != '\0') {
      pQVar1 = this_00->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_50,&this_00->root);
      (**(code **)(*(long *)pQVar1 + 0x128))(pQVar1,(QModelIndex *)local_50);
    }
  }
  pQVar4 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  local_50._0_8_ = QCursor::pos();
  local_58 = QWidget::mapFromGlobal(pQVar4,(QPoint *)local_50);
  pQVar4 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  local_50._0_16_ = (undefined1  [16])QWidget::rect(pQVar4);
  cVar2 = QRect::contains((QPoint *)local_50,SUB81(&local_58,0));
  if (cVar2 != '\0') {
    QAbstractItemViewPrivate::checkMouseMove(this_00,&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::verticalScrollbarValueChanged(int value)
{
    Q_D(QAbstractItemView);
    if (verticalScrollBar()->maximum() == value && d->model->canFetchMore(d->root))
        d->model->fetchMore(d->root);
    QPoint posInVp = viewport()->mapFromGlobal(QCursor::pos());
    if (viewport()->rect().contains(posInVp))
        d->checkMouseMove(posInVp);
}